

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageLayout.cpp
# Opt level: O0

void __thiscall KDReports::Test::testEndlessPrinterBug(Test *this)

{
  byte bVar1;
  int iVar2;
  QColor local_178;
  AutoTableElement local_168 [8];
  AutoTableElement tableElement;
  QString local_148;
  QSqlTableModel local_130 [8];
  QSqlTableModel tableModel;
  QLatin1Char local_11b;
  QChar local_11a;
  QString local_118;
  QString local_100;
  int local_e4;
  undefined1 local_e0 [4];
  int i;
  QSqlDatabase local_c8 [8];
  QString local_c0;
  QSqlQuery local_a8 [8];
  QSqlQuery query;
  QString local_98;
  QLatin1String local_80;
  QString local_70;
  QString local_48;
  QSqlDatabase local_30 [8];
  QSqlDatabase db;
  Report report;
  Test *this_local;
  
  KDReports::Report::Report((Report *)&db,(QObject *)0x0);
  QString::QString(&local_48,"QSQLITE");
  QLatin1String::QLatin1String(&local_80,QSqlDatabase::defaultConnection);
  QString::QString(&local_70,local_80);
  QSqlDatabase::addDatabase((QString *)local_30,(QString *)&local_48);
  QString::~QString(&local_70);
  QString::~QString(&local_48);
  QString::QString(&local_98,":memory:");
  QSqlDatabase::setDatabaseName((QString *)local_30);
  QString::~QString(&local_98);
  bVar1 = QSqlDatabase::open();
  bVar1 = QTest::qVerify((bool)(bVar1 & 1),"db.open()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                         ,0x73);
  if ((bVar1 & 1) != 0) {
    QString::QString(&local_c0);
    QSqlDatabase::QSqlDatabase(local_c8);
    QSqlQuery::QSqlQuery(local_a8,(QString *)&local_c0,local_c8);
    QSqlDatabase::~QSqlDatabase(local_c8);
    QString::~QString(&local_c0);
    QString::QString((QString *)local_e0,
                     "create table airlines (id int primary key, name varchar(20), homecountry varchar(2))"
                    );
    QSqlQuery::exec((QString *)local_a8);
    QString::~QString((QString *)local_e0);
    for (local_e4 = 0; local_e4 < 500; local_e4 = local_e4 + 1) {
      QString::QString(&local_118,"insert into airlines values(%0, \'Test%0\', \'T%0\')");
      iVar2 = local_e4;
      QLatin1Char::QLatin1Char(&local_11b,' ');
      QChar::QChar(&local_11a,local_11b);
      QString::arg(&local_100,&local_118,iVar2,0,10,local_11a);
      QSqlQuery::exec((QString *)local_a8);
      QString::~QString(&local_100);
      QString::~QString(&local_118);
    }
    QSqlTableModel::QSqlTableModel(local_130,(QObject *)0x0,local_30);
    QString::QString(&local_148,"airlines");
    QSqlTableModel::setTable((QString *)local_130);
    QString::~QString(&local_148);
    QSqlTableModel::select();
    KDReports::AutoTableElement::AutoTableElement(local_168,(QAbstractItemModel *)local_130);
    KDReports::AutoTableElement::setVerticalHeaderVisible(SUB81(local_168,0));
    QColor::QColor(&local_178);
    KDReports::Report::addElement(&db,local_168,1,&local_178);
    KDReports::Report::setWidthForEndlessPrinter(105.0);
    iVar2 = KDReports::Report::numberOfPages();
    QTest::qCompare(iVar2,1,"report.numberOfPages()","1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/PageLayout/PageLayout.cpp"
                    ,0x86);
    KDReports::AutoTableElement::~AutoTableElement(local_168);
    QSqlTableModel::~QSqlTableModel(local_130);
    QSqlQuery::~QSqlQuery(local_a8);
  }
  QSqlDatabase::~QSqlDatabase(local_30);
  KDReports::Report::~Report((Report *)&db);
  return;
}

Assistant:

void testEndlessPrinterBug()
    {
        KDReports::Report report;
        QSqlDatabase db = QSqlDatabase::addDatabase("QSQLITE");
        db.setDatabaseName(":memory:");
        QVERIFY(db.open());

        // fill the DB with some test data
        QSqlQuery query;
        query.exec("create table airlines (id int primary key, "
                   "name varchar(20), homecountry varchar(2))");
        for (int i = 0; i < 500; i++)
            query.exec(QString("insert into airlines values(%0, 'Test%0', 'T%0')").arg(i));

        QSqlTableModel tableModel(nullptr, db);
        tableModel.setTable("airlines");
        tableModel.select();

        KDReports::AutoTableElement tableElement(&tableModel);
        tableElement.setVerticalHeaderVisible(false);
        report.addElement(tableElement);

        report.setWidthForEndlessPrinter(105.0);

        QCOMPARE(report.numberOfPages(), 1);
    }